

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall booster::callback<int()>::callback<int(*)()>(callback<int()> *this,_func_int *func)

{
  callable_impl<int,_int_(*)()> *this_00;
  
  this_00 = (callable_impl<int,_int_(*)()> *)operator_new(0x18);
  callback<int_()>::callable_impl<int,_int_(*)()>::callable_impl(this_00,func);
  *(callable_impl<int,_int_(*)()> **)this = this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}